

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O0

EGLConfig deqp::egl::anon_unknown_0::getEGLConfig
                    (Library *egl,EGLDisplay eglDisplay,SurfaceType surfaceType,bool preserveBuffer)

{
  EGLConfig pvVar1;
  undefined1 local_38 [8];
  FilterList filters;
  bool preserveBuffer_local;
  SurfaceType surfaceType_local;
  EGLDisplay eglDisplay_local;
  Library *egl_local;
  
  filters.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = preserveBuffer;
  filters.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = surfaceType;
  eglu::FilterList::FilterList((FilterList *)local_38);
  if (filters.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == SURFACETYPE_WINDOW) {
    eglu::FilterList::operator<<((FilterList *)local_38,isWindow);
  }
  else if (filters.m_rules.
           super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == SURFACETYPE_PBUFFER) {
    eglu::FilterList::operator<<((FilterList *)local_38,isPbuffer);
  }
  eglu::FilterList::operator<<((FilterList *)local_38,isES2Renderable);
  if ((filters.m_rules.
       super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
    eglu::FilterList::operator<<((FilterList *)local_38,hasPreserveSwap);
  }
  pvVar1 = eglu::chooseSingleConfig(egl,eglDisplay,(FilterList *)local_38);
  eglu::FilterList::~FilterList((FilterList *)local_38);
  return pvVar1;
}

Assistant:

EGLConfig getEGLConfig (const Library& egl, EGLDisplay eglDisplay, NegativePartialUpdateTest::SurfaceType surfaceType, bool preserveBuffer)
{
	FilterList filters;
	if (surfaceType == NegativePartialUpdateTest::SURFACETYPE_WINDOW)
		filters << isWindow;
	else if (surfaceType == NegativePartialUpdateTest::SURFACETYPE_PBUFFER)
		filters << isPbuffer;
	else
		DE_FATAL("Invalid surfaceType");

	filters << isES2Renderable;

	if (preserveBuffer)
		filters << hasPreserveSwap;

	return chooseSingleConfig(egl, eglDisplay, filters);
}